

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib582.c
# Opt level: O3

void notifyCurl(CURLM *curl,curl_socket_t s,int evBitmask,char *info)

{
  FILE *__stream;
  uint uVar1;
  undefined8 uVar2;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  int numhandles;
  
  uVar1 = curl_multi_socket_action
                    (curl,CONCAT44(in_register_00000034,s),CONCAT44(in_register_00000014,evBitmask))
  ;
  __stream = _stderr;
  if (uVar1 != 0) {
    uVar2 = curl_multi_strerror(uVar1);
    fprintf(__stream,"Curl error on %s: %i (%s)\n",info,(ulong)uVar1,uVar2);
  }
  return;
}

Assistant:

static void notifyCurl(CURLM *curl, curl_socket_t s, int evBitmask,
                       const char *info)
{
  int numhandles = 0;
  CURLMcode result = curl_multi_socket_action(curl, s, evBitmask, &numhandles);
  if (result != CURLM_OK) {
    fprintf(stderr, "Curl error on %s: %i (%s)\n",
            info, result, curl_multi_strerror(result));
  }
}